

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O0

void sysbvm_sourcePosition_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction
            (sysbvm_sourcePosition_primitive_hash,"SourcePosition::hash");
  sysbvm_primitiveTable_registerFunction(sysbvm_sourcePosition_primitive_equals,"SourcePosition::=")
  ;
  sysbvm_primitiveTable_registerFunction
            (sysbvm_sourcePosition_primitive_startLine,"SourcePosition::startLine");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_sourcePosition_primitive_startColumn,"SourcePosition::startColumn");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_sourcePosition_primitive_endLine,"SourcePosition::endLine");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_sourcePosition_primitive_endColumn,"SourcePosition::endColumn");
  return;
}

Assistant:

void sysbvm_sourcePosition_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_sourcePosition_primitive_hash, "SourcePosition::hash");
    sysbvm_primitiveTable_registerFunction(sysbvm_sourcePosition_primitive_equals, "SourcePosition::=");
    sysbvm_primitiveTable_registerFunction(sysbvm_sourcePosition_primitive_startLine, "SourcePosition::startLine");
    sysbvm_primitiveTable_registerFunction(sysbvm_sourcePosition_primitive_startColumn, "SourcePosition::startColumn");
    sysbvm_primitiveTable_registerFunction(sysbvm_sourcePosition_primitive_endLine, "SourcePosition::endLine");
    sysbvm_primitiveTable_registerFunction(sysbvm_sourcePosition_primitive_endColumn, "SourcePosition::endColumn");
}